

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local_polynomial.hpp
# Opt level: O2

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> * __thiscall
openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::FindMinInteraction
          (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>
           *__return_storage_ptr__,KLocalPolynomial<openjij::graph::Polynomial<double>_> *this,
          double threshold)

{
  double dVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer pvVar2;
  long lVar3;
  runtime_error *prVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  double local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> min_key;
  
  __x = (this->poly_key_list_).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->poly_key_list_).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == __x) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Interactions are empty.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58 = *(this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&min_key,__x);
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    pvVar2 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->poly_key_list_).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
    if ((ulong)(lVar3 / 0x18) <= uVar5) break;
    dVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    if ((((dVar1 != 0.0) || (NAN(dVar1))) && (ABS(dVar1) < ABS(local_58))) &&
       (threshold < ABS(dVar1))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&min_key,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          ((long)&(pvVar2->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data + lVar6));
      local_58 = dVar1;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  if (threshold < ABS(local_58)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->first,&min_key);
    __return_storage_ptr__->second = local_58;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&min_key.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return __return_storage_ptr__;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10,pvVar2,lVar3 % 0x18);
  std::runtime_error::runtime_error(prVar4,"No minimum value in interactions");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::vector<graph::Index>, FloatType>
  FindMinInteraction(const FloatType threshold = 0.0) const {
    if (poly_key_list_.size() == 0) {
      throw std::runtime_error("Interactions are empty.");
    }
    FloatType min_val = poly_value_list_[0];
    std::vector<graph::Index> min_key = poly_key_list_[0];
    for (std::size_t i = 0; i < poly_key_list_.size(); ++i) {
      if (poly_value_list_[i] != 0.0 &&
          std::abs(poly_value_list_[i]) < std::abs(min_val) &&
          threshold < std::abs(poly_value_list_[i])) {
        min_val = poly_value_list_[i];
        min_key = poly_key_list_[i];
      }
    }

    if (std::abs(min_val) <= threshold) {
      throw std::runtime_error("No minimum value in interactions");
    }
    return std::pair<std::vector<graph::Index>, FloatType>(min_key, min_val);
  }